

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O0

QSize __thiscall QDockAreaLayoutItem::sizeHint(QDockAreaLayoutItem *this)

{
  long lVar1;
  QMargins m;
  undefined8 uVar2;
  long *in_RDI;
  long in_FS_OFFSET;
  QMargins QVar3;
  QDockAreaLayoutInfo *in_stack_00000020;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  QSize *in_stack_ffffffffffffffc0;
  QWidget *local_30;
  QSize in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDI[2] == 0) {
    if (*in_RDI == 0) {
      if (in_RDI[1] == 0) {
        QSize::QSize(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
      }
      else {
        in_stack_fffffffffffffff0 = QDockAreaLayoutInfo::sizeHint(in_stack_00000020);
      }
    }
    else {
      uVar2 = (**(code **)(*(long *)*in_RDI + 0x10))();
      (**(code **)(*(long *)*in_RDI + 0x68))();
      QVar3 = QWidget::contentsMargins(local_30);
      m.m_right.m_i = in_stack_fffffffffffffff0.wd.m_i;
      m.m_bottom.m_i = in_stack_fffffffffffffff0.ht.m_i;
      m.m_left.m_i = (int)uVar2;
      m.m_top.m_i = (int)((ulong)uVar2 >> 0x20);
      in_stack_fffffffffffffff0 = QSize::grownBy(QVar3._8_8_,m);
    }
  }
  else {
    QSize::QSize(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_stack_fffffffffffffff0;
  }
  __stack_chk_fail();
}

Assistant:

QSize QDockAreaLayoutItem::sizeHint() const
{
    if (placeHolderItem != nullptr)
        return QSize(0, 0);
    if (widgetItem)
        return widgetItem->sizeHint().grownBy(widgetItem->widget()->contentsMargins());
    if (subinfo != nullptr)
        return subinfo->sizeHint();
    return QSize(-1, -1);
}